

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vvcStreamReader.cpp
# Opt level: O3

void VVCStreamReader::storeBuffer(MemoryBlock *dst,uint8_t *data,uint8_t *dataEnd)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  pointer puVar3;
  pointer puVar4;
  ulong __n;
  ulong __new_size;
  pointer __dest;
  
  puVar2 = dataEnd + -1;
  __n = (long)dataEnd - (long)data;
  do {
    if (puVar2 <= data) {
      return;
    }
    __n = __n - 1;
    puVar1 = puVar2 + -1;
    puVar2 = puVar2 + -1;
  } while (*puVar1 == '\0');
  __new_size = __n & 0xffffffff;
  dst->m_size = __new_size;
  puVar3 = (dst->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (dst->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((ulong)((long)puVar4 - (long)puVar3) < __new_size) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&dst->m_data,__new_size);
    puVar3 = (dst->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start;
    puVar4 = (dst->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_finish;
  }
  __dest = (pointer)0x0;
  if (puVar3 != puVar4) {
    __dest = puVar3;
  }
  memcpy(__dest,data,__n);
  return;
}

Assistant:

void VVCStreamReader::storeBuffer(MemoryBlock& dst, const uint8_t* data, const uint8_t* dataEnd)
{
    dataEnd--;
    while (dataEnd > data && dataEnd[-1] == 0) dataEnd--;
    if (dataEnd > data)
    {
        dst.resize(static_cast<int>(dataEnd - data));
        memcpy(dst.data(), data, dataEnd - data);
    }
}